

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.hpp
# Opt level: O2

int __thiscall List::printPage(List *this,int currIndex)

{
  int iVar1;
  range_error *this_00;
  long lVar2;
  int iVar3;
  long lVar4;
  
  lVar2 = (long)currIndex;
  lVar4 = 0;
  while( true ) {
    iVar3 = (int)lVar4;
    if (this->m_pageSize <= iVar3) {
      return currIndex + iVar3;
    }
    if ((long)this->m_listSize <= lVar2 + lVar4) break;
    iVar1 = this->m_foundIndex;
    *(undefined8 *)(__cxa_rethrow + *(long *)(std::cout + -0x18)) = 6;
    std::ostream::operator<<(&std::cout,iVar1 + 1 + currIndex + iVar3);
    *(undefined8 *)(__cxa_rethrow + *(long *)(std::cout + -0x18)) = 0xc;
    std::operator<<((ostream *)&std::cout,(char *)(this->m_indexArray[lVar2 + lVar4]->field_1).Digit
                   );
    *(undefined8 *)(__cxa_rethrow + *(long *)(std::cout + -0x18)) = 0x20;
    std::operator<<((ostream *)&std::cout,(this->m_indexArray[lVar2 + lVar4]->field_1).data.title);
    *(undefined8 *)(__cxa_rethrow + *(long *)(std::cout + -0x18)) = 0x10;
    std::operator<<((ostream *)&std::cout,
                    (this->m_indexArray[lVar2 + lVar4]->field_1).data.publishingHouse);
    *(undefined8 *)(__cxa_rethrow + *(long *)(std::cout + -0x18)) = 6;
    std::ostream::operator<<(&std::cout,(this->m_indexArray[lVar2 + lVar4]->field_1).data.year);
    *(undefined8 *)(__cxa_rethrow + *(long *)(std::cout + -0x18)) = 6;
    std::ostream::operator<<(&std::cout,(this->m_indexArray[lVar2 + lVar4]->field_1).data.qtyPages);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    lVar4 = lVar4 + 1;
  }
  this_00 = (range_error *)__cxa_allocate_exception(0x10);
  std::range_error::range_error(this_00,"Out of range");
  __cxa_throw(this_00,&std::range_error::typeinfo,std::range_error::~range_error);
}

Assistant:

int printPage(int currIndex) {
        for (int i = 0; i < m_pageSize; ++i, currIndex++) {
            int displayIndex = currIndex + 1 + this->m_foundIndex;
            try {
                if (currIndex >= m_listSize)
                    throw std::range_error("Out of range");
            } catch (std::range_error &e) {
                break;
            }
            cout.width(numbersOutWidth);
            cout << displayIndex;
            cout.width(sizeof(m_head->data.author));
            cout << (m_indexArray[currIndex]->data).author;
            cout.width(sizeof(m_head->data.title));
            cout << (m_indexArray[currIndex]->data).title;
            cout.width(sizeof(m_head->data.publishingHouse));
            cout << (m_indexArray[currIndex]->data).publishingHouse;
            cout.width(numbersOutWidth);
            cout << (m_indexArray[currIndex]->data).year;
            cout.width(numbersOutWidth);
            cout << (m_indexArray[currIndex]->data).qtyPages;
            cout << endl;
        }
        return currIndex;
    }